

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O2

char * bignum_to_string(BIGNUM *bn)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *ret;
  char *local_10;
  
  uVar1 = BN_num_bits((BIGNUM *)bn);
  if (uVar1 < 0x20) {
    pcVar3 = BN_bn2dec((BIGNUM *)bn);
    return pcVar3;
  }
  pcVar3 = BN_bn2hex((BIGNUM *)bn);
  if (pcVar3 == (char *)0x0) {
    local_10 = (char *)0x0;
  }
  else {
    pcVar4 = "";
    if (*pcVar3 == '-') {
      pcVar4 = "-";
    }
    iVar2 = OPENSSL_asprintf(&local_10,"%s0x%s",pcVar4,pcVar3 + (*pcVar3 == '-'));
    if (iVar2 == -1) {
      local_10 = (char *)0x0;
    }
    OPENSSL_free(pcVar3);
  }
  return local_10;
}

Assistant:

static char *bignum_to_string(const BIGNUM *bn) {
  char *tmp, *ret;

  // Display large numbers in hex and small numbers in decimal. Converting to
  // decimal takes quadratic time and is no more useful than hex for large
  // numbers.
  if (BN_num_bits(bn) < 32) {
    return BN_bn2dec(bn);
  }

  tmp = BN_bn2hex(bn);
  if (tmp == NULL) {
    return NULL;
  }

  // Prepend "0x", but place it after the "-" if negative.
  if (OPENSSL_asprintf(&ret, "%s0x%s", (tmp[0] == '-') ? "-" : "",
                       (tmp[0] == '-') ? tmp + 1 : tmp) == -1) {
    ret = nullptr;
  }
  OPENSSL_free(tmp);
  return ret;
}